

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_register_allocation.cpp
# Opt level: O1

void mocker::anon_unknown_1::allocate
               (shared_ptr<mocker::nasm::Inst> *inst,RegMap<std::size_t> *offsets,Section *text)

{
  size_t *psVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  pointer psVar5;
  pointer psVar6;
  int iVar7;
  _Node *p_Var8;
  shared_ptr<mocker::nasm::Register> *psVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  Section *pSVar10;
  bool bVar11;
  shared_ptr<mocker::nasm::Register> pReg;
  shared_ptr<mocker::nasm::Addr> dest;
  shared_ptr<mocker::nasm::Register> vReg;
  shared_ptr<mocker::nasm::Addr> operand;
  shared_ptr<mocker::nasm::LabelAddr> labelAddr;
  shared_ptr<mocker::nasm::MemoryAddr> memAddr;
  shared_ptr<mocker::nasm::Register> reg1;
  shared_ptr<mocker::nasm::Mov> p;
  shared_ptr<mocker::nasm::Addr> local_170;
  Section *local_160;
  shared_ptr<mocker::nasm::Addr> local_158;
  shared_ptr<mocker::nasm::Addr> local_148;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  local_138;
  RegMap<std::size_t> *local_120;
  shared_ptr<mocker::nasm::LabelAddr> local_118;
  undefined1 local_101;
  shared_ptr<mocker::nasm::Addr> local_100;
  shared_ptr<mocker::nasm::MemoryAddr> local_f0;
  shared_ptr<mocker::nasm::Register> local_e0;
  shared_ptr<mocker::nasm::Addr> local_d0;
  shared_ptr<mocker::nasm::Inst> local_c0;
  shared_ptr<mocker::nasm::Inst> local_b0;
  shared_ptr<mocker::nasm::Inst> local_a0;
  long local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  shared_ptr<mocker::nasm::Inst> local_80;
  long local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  long local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  long local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  long local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_160 = text;
  local_120 = offsets;
  nasm::getInvolvedRegs(&local_138,inst);
  psVar6 = local_138.
           super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar5 = local_138.
           super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar11 = true;
  if ((local_138.
       super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       local_138.
       super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     (nasm::dyc<mocker::nasm::Call,std::shared_ptr<mocker::nasm::Inst>const&>
                ((nasm *)&local_40,inst), local_40 != 0)) {
    bVar4 = false;
    bVar3 = false;
    bVar2 = false;
  }
  else {
    nasm::dyc<mocker::nasm::Leave,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_50,inst)
    ;
    if (local_50 == 0) {
      nasm::dyc<mocker::nasm::Ret,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_60,inst)
      ;
      if (local_60 == 0) {
        nasm::dyc<mocker::nasm::Cqo,std::shared_ptr<mocker::nasm::Inst>const&>
                  ((nasm *)&local_70,inst);
        bVar11 = local_70 != 0;
        bVar4 = true;
        bVar3 = true;
        bVar2 = true;
        goto LAB_00128d65;
      }
      bVar3 = true;
    }
    else {
      bVar3 = false;
    }
    bVar2 = false;
    bVar4 = true;
    bVar11 = true;
  }
LAB_00128d65:
  if ((bVar2) && (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if ((bVar3) && (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if ((bVar4) && (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  pSVar10 = local_160;
  if ((psVar5 != psVar6) && (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  std::
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  ::~vector(&local_138);
  if (bVar11) {
    local_80.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (inst->super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_80.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (inst->super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    if (local_80.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_80.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_80.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_80.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_80.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    p_Var8 = std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
             _M_create_node<char_const(&)[1],std::shared_ptr<mocker::nasm::Inst>>
                       ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)
                        &pSVar10->lines,(char (*) [1])0x1b5a6d,&local_80);
    std::__detail::_List_node_base::_M_hook(&p_Var8->super__List_node_base);
    psVar1 = &(pSVar10->lines).
              super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 + 1;
    local_88 = local_80.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
    goto LAB_001298a7;
  }
  nasm::dyc<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_90,inst);
  if (local_90 != 0) {
    local_138.
    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(local_90 + 0x18);
    local_138.
    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(local_90 + 0x20);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_138.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_138.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_138.
             super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_138.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_138.
             super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
      }
    }
    nasm::dyc<mocker::nasm::NumericConstant,std::shared_ptr<mocker::nasm::Addr>&>
              ((nasm *)&local_158,(shared_ptr<mocker::nasm::Addr> *)&local_138);
    if ((element_type *)
        local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      dycPReg((anon_unknown_1 *)&local_170,(shared_ptr<mocker::nasm::Addr> *)&local_138);
      if ((element_type *)
          local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        dycVReg((anon_unknown_1 *)&local_148,(shared_ptr<mocker::nasm::Addr> *)&local_138);
        if ((element_type *)
            local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          nasm::dyc<mocker::nasm::LabelAddr,std::shared_ptr<mocker::nasm::Addr>&>
                    ((nasm *)&local_118,(shared_ptr<mocker::nasm::Addr> *)&local_138);
          if (local_118.super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr == (element_type *)0x0) {
            nasm::dyc<mocker::nasm::MemoryAddr,std::shared_ptr<mocker::nasm::Addr>&>
                      ((nasm *)&local_100,(shared_ptr<mocker::nasm::Addr> *)&local_138);
            if (local_100.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                == (element_type *)0x0) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/naive_register_allocation.cpp"
                            ,99,
                            "void mocker::(anonymous namespace)::allocateMov(const std::shared_ptr<nasm::Mov> &, const RegMap<std::size_t> &, nasm::Section &)"
                           );
            }
            if (local_100.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                [3]._vptr_Addr != (_func_int **)0x0) {
              __assert_fail("!memAddr->getReg2()",
                            "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/naive_register_allocation.cpp"
                            ,0x5a,
                            "void mocker::(anonymous namespace)::allocateMov(const std::shared_ptr<nasm::Mov> &, const RegMap<std::size_t> &, nasm::Section &)"
                           );
            }
            local_e0.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)
                 local_100.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 [1]._vptr_Addr;
            local_e0.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_100.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 [2]._vptr_Addr;
            if (local_e0.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_e0.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_e0.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_e0.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_e0.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            if (local_e0.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_e0.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_e0.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_e0.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_e0.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            local_d0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)
                 local_e0.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
            local_d0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = local_e0.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
            dycVReg((anon_unknown_1 *)&local_f0,&local_d0);
            if (local_f0.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_f0.
                         super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_d0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_d0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            if (local_f0.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr != (element_type *)0x0) {
              if ((nasm::r11()::res == '\0') &&
                 (iVar7 = __cxa_guard_acquire(&nasm::r11()::res), iVar7 != 0)) {
                nasm::r11::res.
                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                          (&nasm::r11::res.
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,(Register **)&nasm::r11::res,
                           (allocator<mocker::nasm::Register> *)&local_f0,(char (*) [4])"r11");
                __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                             ~__shared_ptr,&nasm::r11::res,&__dso_handle);
                __cxa_guard_release(&nasm::r11()::res);
                pSVar10 = local_160;
              }
              loadVReg(&nasm::r11::res,&local_e0,local_120,pSVar10);
              if ((nasm::r11()::res == '\0') &&
                 (iVar7 = __cxa_guard_acquire(&nasm::r11()::res), iVar7 != 0)) {
                nasm::r11::res.
                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                          (&nasm::r11::res.
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,(Register **)&nasm::r11::res,
                           (allocator<mocker::nasm::Register> *)&local_f0,(char (*) [4])"r11");
                __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                             ~__shared_ptr,&nasm::r11::res,&__dso_handle);
                __cxa_guard_release(&nasm::r11()::res);
                pSVar10 = local_160;
              }
              local_e0.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = nasm::r11::res.
                     super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        (&local_e0.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,
                         &nasm::r11::res.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            }
            if ((nasm::r10()::res == '\0') &&
               (iVar7 = __cxa_guard_acquire(&nasm::r10()::res), iVar7 != 0)) {
              nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                        (&nasm::r10::res.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,(Register **)&nasm::r10::res,
                         (allocator<mocker::nasm::Register> *)&local_f0,(char (*) [4])"r10");
              __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                           ~__shared_ptr,&nasm::r10::res,&__dso_handle);
              __cxa_guard_release(&nasm::r10()::res);
              pSVar10 = local_160;
            }
            local_d0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)
                 CONCAT44(local_d0.
                          super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                          _4_4_,*(undefined4 *)
                                 &local_100.
                                  super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr[6]._vptr_Addr);
            local_f0.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::nasm::MemoryAddr,std::allocator<mocker::nasm::MemoryAddr>,std::shared_ptr<mocker::nasm::Register>&,int>
                      (&local_f0.
                        super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(MemoryAddr **)&local_f0,
                       (allocator<mocker::nasm::MemoryAddr> *)&local_101,&local_e0,(int *)&local_d0)
            ;
            nasm::Section::
            emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::MemoryAddr>>
                      (pSVar10,&nasm::r10::res,&local_f0);
            if (local_f0.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_f0.
                         super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_e0.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_e0.
                         super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_100.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_100.
                         super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
          else {
            if ((nasm::r10()::res == '\0') &&
               (iVar7 = __cxa_guard_acquire(&nasm::r10()::res), iVar7 != 0)) {
              nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                        (&nasm::r10::res.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,(Register **)&nasm::r10::res,
                         (allocator<mocker::nasm::Register> *)&local_100,(char (*) [4])"r10");
              __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                           ~__shared_ptr,&nasm::r10::res,&__dso_handle);
              __cxa_guard_release(&nasm::r10()::res);
              pSVar10 = local_160;
            }
            nasm::Section::
            emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::LabelAddr>&>
                      (pSVar10,&nasm::r10::res,&local_118);
          }
          if (local_118.super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_118.
                       super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
        else {
          if ((nasm::r10()::res == '\0') &&
             (iVar7 = __cxa_guard_acquire(&nasm::r10()::res), iVar7 != 0)) {
            nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                      (&nasm::r10::res.
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(Register **)&nasm::r10::res,
                       (allocator<mocker::nasm::Register> *)&local_118,(char (*) [4])"r10");
            __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                         ~__shared_ptr,&nasm::r10::res,&__dso_handle);
            __cxa_guard_release(&nasm::r10()::res);
            pSVar10 = local_160;
          }
          loadVReg(&nasm::r10::res,(shared_ptr<mocker::nasm::Register> *)&local_148,local_120,
                   pSVar10);
        }
        if (local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      else {
        if ((nasm::r10()::res == '\0') &&
           (iVar7 = __cxa_guard_acquire(&nasm::r10()::res), iVar7 != 0)) {
          nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                    (&nasm::r10::res.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(Register **)&nasm::r10::res,
                     (allocator<mocker::nasm::Register> *)&local_148,(char (*) [4])"r10");
          __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                       ~__shared_ptr,&nasm::r10::res,&__dso_handle);
          __cxa_guard_release(&nasm::r10()::res);
          pSVar10 = local_160;
        }
        nasm::Section::
        emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Register>&>
                  (pSVar10,&nasm::r10::res,(shared_ptr<mocker::nasm::Register> *)&local_170);
      }
      if (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    else {
      if ((nasm::r10()::res == '\0') && (iVar7 = __cxa_guard_acquire(&nasm::r10()::res), iVar7 != 0)
         ) {
        nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                  (&nasm::r10::res.
                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(Register **)&nasm::r10::res,
                   (allocator<mocker::nasm::Register> *)&local_170,(char (*) [4])"r10");
        __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                     ~__shared_ptr,&nasm::r10::res,&__dso_handle);
        __cxa_guard_release(&nasm::r10()::res);
        pSVar10 = local_160;
      }
      nasm::Section::
      emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::NumericConstant>&>
                (pSVar10,&nasm::r10::res,(shared_ptr<mocker::nasm::NumericConstant> *)&local_158);
    }
    if (local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)(local_90 + 8);
    local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_90 + 0x10);
    if (local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    dycPReg((anon_unknown_1 *)&local_170,&local_158);
    if ((element_type *)
        local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      dycVReg((anon_unknown_1 *)&local_170,&local_158);
      if ((element_type *)
          local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        if (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        nasm::dyc<mocker::nasm::LabelAddr,std::shared_ptr<mocker::nasm::Addr>&>
                  ((nasm *)&local_170,&local_158);
        if ((element_type *)
            local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          if ((nasm::r10()::res == '\0') &&
             (iVar7 = __cxa_guard_acquire(&nasm::r10()::res), iVar7 != 0)) {
            nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                      (&nasm::r10::res.
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(Register **)&nasm::r10::res,
                       (allocator<mocker::nasm::Register> *)&local_148,(char (*) [4])"r10");
            __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                         ~__shared_ptr,&nasm::r10::res,&__dso_handle);
            __cxa_guard_release(&nasm::r10()::res);
            pSVar10 = local_160;
          }
          nasm::Section::
          emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::LabelAddr>&,std::shared_ptr<mocker::nasm::Register>const&>
                    (pSVar10,(shared_ptr<mocker::nasm::LabelAddr> *)&local_170,&nasm::r10::res);
          goto LAB_00129872;
        }
        if (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        nasm::dyc<mocker::nasm::MemoryAddr,std::shared_ptr<mocker::nasm::Addr>&>
                  ((nasm *)&local_170,&local_158);
        if ((element_type *)
            local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/naive_register_allocation.cpp"
                        ,0x81,
                        "void mocker::(anonymous namespace)::allocateMov(const std::shared_ptr<nasm::Mov> &, const RegMap<std::size_t> &, nasm::Section &)"
                       );
        }
        if ((((string *)
             ((long)local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 8))->field_2)._M_allocated_capacity != 0) {
          __assert_fail("!memAddr->getReg2()",
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/naive_register_allocation.cpp"
                        ,0x75,
                        "void mocker::(anonymous namespace)::allocateMov(const std::shared_ptr<nasm::Mov> &, const RegMap<std::size_t> &, nasm::Section &)"
                       );
        }
        local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             (((string *)
              ((long)local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr + 8))->_M_dataplus)._M_p;
        local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((string *)
                ((long)local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + 8))->_M_string_length;
        if (local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        if (local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_100.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_100.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
        dycVReg((anon_unknown_1 *)&local_118,&local_100);
        if (local_118.super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_118.
                     super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_100.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_100.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_118.super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            != (element_type *)0x0) {
          if ((nasm::r11()::res == '\0') &&
             (iVar7 = __cxa_guard_acquire(&nasm::r11()::res), iVar7 != 0)) {
            nasm::r11::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                      (&nasm::r11::res.
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(Register **)&nasm::r11::res,
                       (allocator<mocker::nasm::Register> *)&local_118,(char (*) [4])"r11");
            __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                         ~__shared_ptr,&nasm::r11::res,&__dso_handle);
            __cxa_guard_release(&nasm::r11()::res);
            pSVar10 = local_160;
          }
          loadVReg(&nasm::r11::res,(shared_ptr<mocker::nasm::Register> *)&local_148,local_120,
                   pSVar10);
          if ((nasm::r11()::res == '\0') &&
             (iVar7 = __cxa_guard_acquire(&nasm::r11()::res), iVar7 != 0)) {
            nasm::r11::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                      (&nasm::r11::res.
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(Register **)&nasm::r11::res,
                       (allocator<mocker::nasm::Register> *)&local_118,(char (*) [4])"r11");
            __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                         ~__shared_ptr,&nasm::r11::res,&__dso_handle);
            __cxa_guard_release(&nasm::r11()::res);
            pSVar10 = local_160;
          }
          local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               &(nasm::r11::res.
                 super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_Addr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     &nasm::r11::res.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        if ((nasm::r11()::res == '\0') &&
           (iVar7 = __cxa_guard_acquire(&nasm::r11()::res), iVar7 != 0)) {
          nasm::r11::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                    (&nasm::r11::res.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(Register **)&nasm::r11::res,
                     (allocator<mocker::nasm::Register> *)&local_100,(char (*) [4])"r11");
          __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                       ~__shared_ptr,&nasm::r11::res,&__dso_handle);
          __cxa_guard_release(&nasm::r11()::res);
          pSVar10 = local_160;
        }
        local_100.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             CONCAT44(local_100.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr._4_4_,
                      *(undefined4 *)
                       &(((element_type *)
                         ((long)local_170.
                                super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr + 0x28))->identifier)._M_dataplus._M_p);
        local_118.super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<mocker::nasm::MemoryAddr,std::allocator<mocker::nasm::MemoryAddr>,std::shared_ptr<mocker::nasm::Register>const&,int>
                  (&local_118.
                    super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(MemoryAddr **)&local_118,
                   (allocator<mocker::nasm::MemoryAddr> *)&local_e0,&nasm::r11::res,
                   (int *)&local_100);
        if ((nasm::r10()::res == '\0') &&
           (iVar7 = __cxa_guard_acquire(&nasm::r10()::res), iVar7 != 0)) {
          nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                    (&nasm::r10::res.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(Register **)&nasm::r10::res,
                     (allocator<mocker::nasm::Register> *)&local_e0,(char (*) [4])"r10");
          __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                       ~__shared_ptr,&nasm::r10::res,&__dso_handle);
          __cxa_guard_release(&nasm::r10()::res);
          pSVar10 = local_160;
        }
        nasm::Section::
        emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::MemoryAddr>,std::shared_ptr<mocker::nasm::Register>const&>
                  (pSVar10,(shared_ptr<mocker::nasm::MemoryAddr> *)&local_118,&nasm::r10::res);
        if (local_118.super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_118.
                     super___shared_ptr<mocker::nasm::LabelAddr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      else {
        if ((nasm::r10()::res == '\0') &&
           (iVar7 = __cxa_guard_acquire(&nasm::r10()::res), iVar7 != 0)) {
          nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                    (&nasm::r10::res.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(Register **)&nasm::r10::res,
                     (allocator<mocker::nasm::Register> *)&local_118,(char (*) [4])"r10");
          __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                       ~__shared_ptr,&nasm::r10::res,&__dso_handle);
          __cxa_guard_release(&nasm::r10()::res);
          pSVar10 = local_160;
        }
        local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             &(nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super_Addr;
        local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = nasm::r10::res.
                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
        if (nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (nasm::r10::res.
                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (nasm::r10::res.
                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi)->_M_use_count + 1;
          }
        }
        storeVReg((shared_ptr<mocker::nasm::Register> *)&local_170,&local_148,local_120,pSVar10);
      }
      if (local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    else {
      if ((nasm::r10()::res == '\0') && (iVar7 = __cxa_guard_acquire(&nasm::r10()::res), iVar7 != 0)
         ) {
        nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                  (&nasm::r10::res.
                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(Register **)&nasm::r10::res,
                   (allocator<mocker::nasm::Register> *)&local_148,(char (*) [4])"r10");
        __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                     ~__shared_ptr,&nasm::r10::res,&__dso_handle);
        __cxa_guard_release(&nasm::r10()::res);
        pSVar10 = local_160;
      }
      nasm::Section::
      emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Register>const&>
                (pSVar10,(shared_ptr<mocker::nasm::Register> *)&local_170,&nasm::r10::res);
    }
LAB_00129872:
    if (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_138.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_138.
                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    goto LAB_001298a7;
  }
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
  }
  nasm::dyc<mocker::nasm::BinaryInst,std::shared_ptr<mocker::nasm::Inst>const&>
            ((nasm *)&local_138,inst);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_138.
      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_138.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_138.
                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    nasm::dyc<mocker::nasm::Push,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_138,inst)
    ;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_138.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_138.
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_138.
                   super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      nasm::dyc<mocker::nasm::Pop,std::shared_ptr<mocker::nasm::Inst>const&>
                ((nasm *)&local_138,inst);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_138.
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_138.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_138.
                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
        nasm::dyc<mocker::nasm::Lea,std::shared_ptr<mocker::nasm::Inst>const&>
                  ((nasm *)&local_138,inst);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_138.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_138.
              super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_138.
                       super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
          }
          nasm::dyc<mocker::nasm::Cmp,std::shared_ptr<mocker::nasm::Inst>const&>
                    ((nasm *)&local_138,inst);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_138.
              super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_138.
                super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_138.
                         super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
            }
            nasm::dyc<mocker::nasm::Set,std::shared_ptr<mocker::nasm::Inst>const&>
                      ((nasm *)&local_138,inst);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_138.
                super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_138.
                  super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_138.
                           super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
              }
              nasm::dyc<mocker::nasm::UnaryInst,std::shared_ptr<mocker::nasm::Inst>const&>
                        ((nasm *)&local_138,inst);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_138.
                  super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_138.
                    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_138.
                             super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
                }
                nasm::dyc<mocker::nasm::IDiv,std::shared_ptr<mocker::nasm::Inst>const&>
                          ((nasm *)&local_138,inst);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_138.
                    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ._M_impl.super__Vector_impl_data._M_start ==
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_138.
                      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_138.
                               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
                  }
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/naive_register_allocation.cpp"
                                ,0xee,
                                "void mocker::(anonymous namespace)::allocate(const std::shared_ptr<nasm::Inst> &, const RegMap<std::size_t> &, nasm::Section &)"
                               );
                }
                dycVReg((anon_unknown_1 *)&local_158,
                        (shared_ptr<mocker::nasm::Addr> *)
                        ((long)local_138.
                               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 8));
                if ((element_type *)
                    local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr != (element_type *)0x0) {
                  if ((nasm::r10()::res == '\0') &&
                     (iVar7 = __cxa_guard_acquire(&nasm::r10()::res), iVar7 != 0)) {
                    nasm::r10::res.
                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)0x0;
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                    __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                              (&nasm::r10::res.
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount,(Register **)&nasm::r10::res,
                               (allocator<mocker::nasm::Register> *)&local_170,(char (*) [4])"r10");
                    __cxa_atexit(std::
                                 __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                                 ~__shared_ptr,&nasm::r10::res,&__dso_handle);
                    __cxa_guard_release(&nasm::r10()::res);
                    pSVar10 = local_160;
                  }
                  loadVReg(&nasm::r10::res,(shared_ptr<mocker::nasm::Register> *)&local_158,
                           local_120,pSVar10);
                  if ((nasm::r10()::res == '\0') &&
                     (iVar7 = __cxa_guard_acquire(&nasm::r10()::res), iVar7 != 0)) {
                    nasm::r10::res.
                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)0x0;
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                    __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                              (&nasm::r10::res.
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount,(Register **)&nasm::r10::res,
                               (allocator<mocker::nasm::Register> *)&local_170,(char (*) [4])"r10");
                    __cxa_atexit(std::
                                 __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                                 ~__shared_ptr,&nasm::r10::res,&__dso_handle);
                    __cxa_guard_release(&nasm::r10()::res);
                    pSVar10 = local_160;
                  }
                  nasm::Section::
                  emplaceInst<mocker::nasm::IDiv,std::shared_ptr<mocker::nasm::Register>const&>
                            (pSVar10,&nasm::r10::res);
                  goto LAB_001292fb;
                }
                local_c0.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)
                     local_138.
                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                local_c0.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_138.
                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_138.
                    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  pSVar10 = local_160;
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    *(_Atomic_word *)
                     ((long)local_138.
                            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + 8) =
                         *(_Atomic_word *)
                          ((long)local_138.
                                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
                    UNLOCK();
                  }
                  else {
                    *(_Atomic_word *)
                     ((long)local_138.
                            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + 8) =
                         *(_Atomic_word *)
                          ((long)local_138.
                                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
                  }
                }
                p_Var8 = std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
                         _M_create_node<char_const(&)[1],std::shared_ptr<mocker::nasm::Inst>>
                                   ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)
                                    &pSVar10->lines,(char (*) [1])0x1b5a6d,&local_c0);
                std::__detail::_List_node_base::_M_hook(&p_Var8->super__List_node_base);
                psVar1 = &(pSVar10->lines).
                          super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>.
                          _M_impl._M_node._M_size;
                *psVar1 = *psVar1 + 1;
                this._M_pi = local_c0.
                             super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi;
              }
              else {
                local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     = (element_type *)
                       ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       (local_138.
                        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1))->_vptr__Sp_counted_base;
                local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                      &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       (local_138.
                        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1))->_M_use_count;
                if (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_170.
                          super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_170.
                          super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                dycVReg((anon_unknown_1 *)&local_158,&local_170);
                if (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_170.
                             super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                if ((element_type *)
                    local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr == (element_type *)0x0) {
                  local_b0.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       = (element_type *)
                         local_138.
                         super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                  local_b0.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi =
                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_138.
                       super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_138.
                      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      *(_Atomic_word *)
                       ((long)local_138.
                              super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + 8) =
                           *(_Atomic_word *)
                            ((long)local_138.
                                   super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
                      UNLOCK();
                    }
                    else {
                      *(_Atomic_word *)
                       ((long)local_138.
                              super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + 8) =
                           *(_Atomic_word *)
                            ((long)local_138.
                                   super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
                    }
                  }
                  nasm::Section::appendInst(pSVar10,&local_b0);
                  this._M_pi = local_b0.
                               super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi;
                }
                else {
                  psVar9 = nasm::r10();
                  loadVReg(psVar9,(shared_ptr<mocker::nasm::Register> *)&local_158,local_120,pSVar10
                          );
                  local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)
                           CONCAT44(local_170.
                                    super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr._4_4_,
                                    *(_Atomic_word *)
                                     ((long)local_138.
                                            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 8));
                  psVar9 = nasm::r10();
                  nasm::Section::
                  emplaceInst<mocker::nasm::UnaryInst,mocker::nasm::UnaryInst::OpType,std::shared_ptr<mocker::nasm::Register>const&>
                            (pSVar10,(OpType *)&local_170,psVar9);
                  psVar9 = nasm::r10();
                  local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = &((psVar9->
                             super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>)
                            ._M_ptr)->super_Addr;
                  local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi =
                       (psVar9->
                       super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>).
                       _M_refcount._M_pi;
                  if (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_use_count =
                           (local_170.
                            super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_use_count =
                           (local_170.
                            super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
                    }
                  }
                  storeVReg((shared_ptr<mocker::nasm::Register> *)&local_158,&local_170,local_120,
                            pSVar10);
                  this._M_pi = local_170.
                               super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi;
                }
              }
            }
            else {
              local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   (local_138.
                    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1))->_vptr__Sp_counted_base;
              local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                    &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     (local_138.
                      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1))->_M_use_count;
              if (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              dycVReg((anon_unknown_1 *)&local_158,&local_170);
              if (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_170.
                           super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if ((element_type *)
                  local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr != (element_type *)0x0) {
                local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     = (element_type *)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[5]>
                          (&local_170.
                            super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,(Register **)&local_170,
                           (allocator<mocker::nasm::Register> *)&local_148,(char (*) [5])"r10b");
                local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     = (element_type *)
                       CONCAT44(local_148.
                                super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr._4_4_,
                                *(_Atomic_word *)
                                 ((long)local_138.
                                        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 8));
                nasm::Section::
                emplaceInst<mocker::nasm::Set,mocker::nasm::Set::OpType,std::shared_ptr<mocker::nasm::Register>&>
                          (pSVar10,(OpType *)&local_148,
                           (shared_ptr<mocker::nasm::Register> *)&local_170);
                if ((nasm::r10()::res == '\0') &&
                   (iVar7 = __cxa_guard_acquire(&nasm::r10()::res), iVar7 != 0)) {
                  nasm::r10::res.
                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       (element_type *)0x0;
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                  __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                            (&nasm::r10::res.
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount,(Register **)&nasm::r10::res,
                             (allocator<mocker::nasm::Register> *)&local_118,(char (*) [4])"r10");
                  __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                               ::~__shared_ptr,&nasm::r10::res,&__dso_handle);
                  __cxa_guard_release(&nasm::r10()::res);
                  pSVar10 = local_160;
                }
                local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     = &(nasm::r10::res.
                         super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->super_Addr;
                local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     nasm::r10::res.
                     super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
                if (nasm::r10::res.
                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (nasm::r10::res.
                     super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (nasm::r10::res.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (nasm::r10::res.
                     super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (nasm::r10::res.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                storeVReg((shared_ptr<mocker::nasm::Register> *)&local_158,&local_148,local_120,
                          pSVar10);
                goto LAB_001291c0;
              }
              local_a0.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)
                   local_138.
                   super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_a0.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_138.
                   super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_138.
                  super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(_Atomic_word *)
                   ((long)local_138.
                          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 8) =
                       *(_Atomic_word *)
                        ((long)local_138.
                               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
                  UNLOCK();
                }
                else {
                  *(_Atomic_word *)
                   ((long)local_138.
                          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 8) =
                       *(_Atomic_word *)
                        ((long)local_138.
                               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
                }
              }
              p_Var8 = std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
                       _M_create_node<char_const(&)[1],std::shared_ptr<mocker::nasm::Inst>>
                                 ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)
                                  &pSVar10->lines,(char (*) [1])0x1b5a6d,&local_a0);
              std::__detail::_List_node_base::_M_hook(&p_Var8->super__List_node_base);
              psVar1 = &(pSVar10->lines).
                        super__List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>.
                        _M_impl._M_node._M_size;
              *psVar1 = *psVar1 + 1;
              this._M_pi = local_a0.
                           super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
            }
          }
          else {
            local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 *(element_type **)
                  ((long)local_138.
                         super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 8);
            local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     (local_138.
                      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1))->_vptr__Sp_counted_base;
            if (local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            dycVReg((anon_unknown_1 *)&local_170,&local_158);
            if ((element_type *)
                local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                != (element_type *)0x0) {
              if ((nasm::r10()::res == '\0') &&
                 (iVar7 = __cxa_guard_acquire(&nasm::r10()::res), iVar7 != 0)) {
                nasm::r10::res.
                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                          (&nasm::r10::res.
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,(Register **)&nasm::r10::res,
                           (allocator<mocker::nasm::Register> *)&local_148,(char (*) [4])"r10");
                __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                             ~__shared_ptr,&nasm::r10::res,&__dso_handle);
                __cxa_guard_release(&nasm::r10()::res);
                pSVar10 = local_160;
              }
              loadVReg(&nasm::r10::res,(shared_ptr<mocker::nasm::Register> *)&local_170,local_120,
                       pSVar10);
              if ((nasm::r10()::res == '\0') &&
                 (iVar7 = __cxa_guard_acquire(&nasm::r10()::res), iVar7 != 0)) {
                nasm::r10::res.
                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                          (&nasm::r10::res.
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,(Register **)&nasm::r10::res,
                           (allocator<mocker::nasm::Register> *)&local_148,(char (*) [4])"r10");
                __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                             ~__shared_ptr,&nasm::r10::res,&__dso_handle);
                __cxa_guard_release(&nasm::r10()::res);
                pSVar10 = local_160;
              }
              local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   &(nasm::r10::res.
                     super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->super_Addr;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        (&local_158.
                          super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,
                         &nasm::r10::res.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            }
            if (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_170.
                         super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 *(element_type **)
                  &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   (local_138.
                    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1))->_M_use_count;
            local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     (local_138.
                      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 2))->_vptr__Sp_counted_base;
            if (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            dycVReg((anon_unknown_1 *)&local_148,&local_170);
            if ((element_type *)
                local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                != (element_type *)0x0) {
              if ((nasm::r11()::res == '\0') &&
                 (iVar7 = __cxa_guard_acquire(&nasm::r11()::res), iVar7 != 0)) {
                nasm::r11::res.
                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                          (&nasm::r11::res.
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,(Register **)&nasm::r11::res,
                           (allocator<mocker::nasm::Register> *)&local_118,(char (*) [4])"r11");
                __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                             ~__shared_ptr,&nasm::r11::res,&__dso_handle);
                __cxa_guard_release(&nasm::r11()::res);
                pSVar10 = local_160;
              }
              loadVReg(&nasm::r11::res,(shared_ptr<mocker::nasm::Register> *)&local_148,local_120,
                       pSVar10);
              if ((nasm::r11()::res == '\0') &&
                 (iVar7 = __cxa_guard_acquire(&nasm::r11()::res), iVar7 != 0)) {
                nasm::r11::res.
                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                          (&nasm::r11::res.
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,(Register **)&nasm::r11::res,
                           (allocator<mocker::nasm::Register> *)&local_118,(char (*) [4])"r11");
                __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                             ~__shared_ptr,&nasm::r11::res,&__dso_handle);
                __cxa_guard_release(&nasm::r11()::res);
                pSVar10 = local_160;
              }
              local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   &(nasm::r11::res.
                     super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->super_Addr;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        (&local_170.
                          super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,
                         &nasm::r11::res.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            }
            if (local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_148.
                         super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            nasm::Section::
            emplaceInst<mocker::nasm::Cmp,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Addr>&>
                      (pSVar10,&local_158,&local_170);
            this._M_pi = local_170.
                         super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          }
        }
        else {
          local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(element_type **)
                ((long)local_138.
                       super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 8);
          local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (local_138.
                   super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1))->_vptr__Sp_counted_base;
          if (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          dycVReg((anon_unknown_1 *)&local_158,&local_170);
          if (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((element_type *)
              local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) goto LAB_001292fb;
          if ((nasm::r10()::res == '\0') &&
             (iVar7 = __cxa_guard_acquire(&nasm::r10()::res), iVar7 != 0)) {
            nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                      (&nasm::r10::res.
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(Register **)&nasm::r10::res,
                       (allocator<mocker::nasm::Register> *)&local_170,(char (*) [4])"r10");
            __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                         ~__shared_ptr,&nasm::r10::res,&__dso_handle);
            __cxa_guard_release(&nasm::r10()::res);
            pSVar10 = local_160;
          }
          nasm::Section::
          emplaceInst<mocker::nasm::Lea,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Addr>const&>
                    (pSVar10,&nasm::r10::res,
                     (shared_ptr<mocker::nasm::Addr> *)
                     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      (local_138.
                       super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1))->_M_use_count);
          if ((nasm::r10()::res == '\0') &&
             (iVar7 = __cxa_guard_acquire(&nasm::r10()::res), iVar7 != 0)) {
            nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                      (&nasm::r10::res.
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(Register **)&nasm::r10::res,
                       (allocator<mocker::nasm::Register> *)&local_148,(char (*) [4])"r10");
            __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                         ~__shared_ptr,&nasm::r10::res,&__dso_handle);
            __cxa_guard_release(&nasm::r10()::res);
            pSVar10 = local_160;
          }
          local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               &(nasm::r10::res.
                 super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_Addr;
          local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = nasm::r10::res.
                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi;
          if (nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi)->_M_use_count =
                   (nasm::r10::res.
                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi)->_M_use_count =
                   (nasm::r10::res.
                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          storeVReg((shared_ptr<mocker::nasm::Register> *)&local_158,&local_170,local_120,pSVar10);
          this._M_pi = local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
        }
      }
      else {
        local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(element_type **)
              ((long)local_138.
                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 8);
        local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (local_138.
                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1))->_vptr__Sp_counted_base;
        if (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        dycVReg((anon_unknown_1 *)&local_158,&local_170);
        if (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((element_type *)
            local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          __assert_fail("reg",
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/naive_register_allocation.cpp"
                        ,0xb2,
                        "void mocker::(anonymous namespace)::allocate(const std::shared_ptr<nasm::Inst> &, const RegMap<std::size_t> &, nasm::Section &)"
                       );
        }
        if ((nasm::r10()::res == '\0') &&
           (iVar7 = __cxa_guard_acquire(&nasm::r10()::res), iVar7 != 0)) {
          nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                    (&nasm::r10::res.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(Register **)&nasm::r10::res,
                     (allocator<mocker::nasm::Register> *)&local_170,(char (*) [4])"r10");
          __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                       ~__shared_ptr,&nasm::r10::res,&__dso_handle);
          __cxa_guard_release(&nasm::r10()::res);
          pSVar10 = local_160;
        }
        nasm::Section::emplaceInst<mocker::nasm::Pop,std::shared_ptr<mocker::nasm::Register>const&>
                  (pSVar10,&nasm::r10::res);
        if ((nasm::r10()::res == '\0') &&
           (iVar7 = __cxa_guard_acquire(&nasm::r10()::res), iVar7 != 0)) {
          nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                    (&nasm::r10::res.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(Register **)&nasm::r10::res,
                     (allocator<mocker::nasm::Register> *)&local_148,(char (*) [4])"r10");
          __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                       ~__shared_ptr,&nasm::r10::res,&__dso_handle);
          __cxa_guard_release(&nasm::r10()::res);
          pSVar10 = local_160;
        }
        local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             &(nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super_Addr;
        local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = nasm::r10::res.
                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
        if (nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (nasm::r10::res.
                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (nasm::r10::res.
                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi)->_M_use_count + 1;
          }
        }
        storeVReg((shared_ptr<mocker::nasm::Register> *)&local_158,&local_170,local_120,pSVar10);
        this._M_pi = local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
      }
      goto LAB_001291d4;
    }
    local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)
          ((long)local_138.
                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 8);
    local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (local_138.
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ._M_impl.super__Vector_impl_data._M_start + 1))->_vptr__Sp_counted_base;
    if (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    dycVReg((anon_unknown_1 *)&local_158,&local_170);
    if (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((element_type *)
        local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      __assert_fail("reg",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/naive_register_allocation.cpp"
                    ,0xab,
                    "void mocker::(anonymous namespace)::allocate(const std::shared_ptr<nasm::Inst> &, const RegMap<std::size_t> &, nasm::Section &)"
                   );
    }
    if ((nasm::r10()::res == '\0') && (iVar7 = __cxa_guard_acquire(&nasm::r10()::res), iVar7 != 0))
    {
      nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                (&nasm::r10::res.
                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ,(Register **)&nasm::r10::res,(allocator<mocker::nasm::Register> *)&local_170,
                 (char (*) [4])"r10");
      __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&nasm::r10::res,&__dso_handle);
      __cxa_guard_release(&nasm::r10()::res);
      pSVar10 = local_160;
    }
    loadVReg(&nasm::r10::res,(shared_ptr<mocker::nasm::Register> *)&local_158,local_120,pSVar10);
    if ((nasm::r10()::res == '\0') && (iVar7 = __cxa_guard_acquire(&nasm::r10()::res), iVar7 != 0))
    {
      nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                (&nasm::r10::res.
                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ,(Register **)&nasm::r10::res,(allocator<mocker::nasm::Register> *)&local_170,
                 (char (*) [4])"r10");
      __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&nasm::r10::res,&__dso_handle);
      __cxa_guard_release(&nasm::r10()::res);
      pSVar10 = local_160;
    }
    nasm::Section::emplaceInst<mocker::nasm::Push,std::shared_ptr<mocker::nasm::Register>const&>
              (pSVar10,&nasm::r10::res);
  }
  else {
    local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (local_138.
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ._M_impl.super__Vector_impl_data._M_start + 2))->_vptr__Sp_counted_base;
    local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
          &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (local_138.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 2))->_M_use_count;
    if (local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    dycVReg((anon_unknown_1 *)&local_170,&local_158);
    if ((element_type *)
        local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if ((nasm::r10()::res == '\0') && (iVar7 = __cxa_guard_acquire(&nasm::r10()::res), iVar7 != 0)
         ) {
        nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                  (&nasm::r10::res.
                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(Register **)&nasm::r10::res,
                   (allocator<mocker::nasm::Register> *)&local_148,(char (*) [4])"r10");
        __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                     ~__shared_ptr,&nasm::r10::res,&__dso_handle);
        __cxa_guard_release(&nasm::r10()::res);
        pSVar10 = local_160;
      }
      loadVReg(&nasm::r10::res,(shared_ptr<mocker::nasm::Register> *)&local_170,local_120,pSVar10);
      if ((nasm::r10()::res == '\0') && (iVar7 = __cxa_guard_acquire(&nasm::r10()::res), iVar7 != 0)
         ) {
        nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                  (&nasm::r10::res.
                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(Register **)&nasm::r10::res,
                   (allocator<mocker::nasm::Register> *)&local_148,(char (*) [4])"r10");
        __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                     ~__shared_ptr,&nasm::r10::res,&__dso_handle);
        __cxa_guard_release(&nasm::r10()::res);
        pSVar10 = local_160;
      }
      local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &(nasm::r10::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->super_Addr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 &nasm::r10::res.
                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
    }
    if (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (local_138.
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ._M_impl.super__Vector_impl_data._M_start + 1))->_vptr__Sp_counted_base;
    local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
          &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (local_138.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 1))->_M_use_count;
    if (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    dycVReg((anon_unknown_1 *)&local_148,&local_170);
    if ((element_type *)
        local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if ((nasm::r11()::res == '\0') && (iVar7 = __cxa_guard_acquire(&nasm::r11()::res), iVar7 != 0)
         ) {
        nasm::r11::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                  (&nasm::r11::res.
                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(Register **)&nasm::r11::res,
                   (allocator<mocker::nasm::Register> *)&local_118,(char (*) [4])"r11");
        __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                     ~__shared_ptr,&nasm::r11::res,&__dso_handle);
        __cxa_guard_release(&nasm::r11()::res);
        pSVar10 = local_160;
      }
      loadVReg(&nasm::r11::res,(shared_ptr<mocker::nasm::Register> *)&local_148,local_120,pSVar10);
      if ((nasm::r11()::res == '\0') && (iVar7 = __cxa_guard_acquire(&nasm::r11()::res), iVar7 != 0)
         ) {
        nasm::r11::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                  (&nasm::r11::res.
                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(Register **)&nasm::r11::res,
                   (allocator<mocker::nasm::Register> *)&local_118,(char (*) [4])"r11");
        __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                     ~__shared_ptr,&nasm::r11::res,&__dso_handle);
        __cxa_guard_release(&nasm::r11()::res);
        pSVar10 = local_160;
      }
      local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &(nasm::r11::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->super_Addr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 &nasm::r11::res.
                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
    }
    if (local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         CONCAT44(local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr._4_4_,
                  *(_Atomic_word *)
                   ((long)local_138.
                          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 8));
    nasm::Section::
    emplaceInst<mocker::nasm::BinaryInst,mocker::nasm::BinaryInst::OpType,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Addr>&>
              (pSVar10,(OpType *)&local_148,&local_170,&local_158);
    dycVReg((anon_unknown_1 *)&local_148,
            (shared_ptr<mocker::nasm::Addr> *)
            (local_138.
             super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1));
    if ((element_type *)
        local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      storeVReg((shared_ptr<mocker::nasm::Register> *)&local_148,&local_170,local_120,pSVar10);
    }
LAB_001291c0:
    this._M_pi = local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
    if (local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_148.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      this._M_pi = local_170.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
    }
LAB_001291d4:
    if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
    }
  }
LAB_001292fb:
  local_88 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_138.
             super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    local_88 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_138.
               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  }
LAB_001298a7:
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
  }
  return;
}

Assistant:

void allocate(const std::shared_ptr<nasm::Inst> &inst,
              const RegMap<std::size_t> &offsets, nasm::Section &text) {
  if (nasm::getInvolvedRegs(inst).empty() || nasm::dyc<nasm::Call>(inst) ||
      nasm::dyc<nasm::Leave>(inst) || nasm::dyc<nasm::Ret>(inst) ||
      nasm::dyc<nasm::Cqo>(inst)) {
    text.appendInst(inst);
    return;
  }
  auto load = [&offsets, &text](const std::shared_ptr<nasm::Register> &dest,
                                const std::shared_ptr<nasm::Register> &src) {
    loadVReg(dest, src, offsets, text);
  };
  auto store = [&offsets, &text](const std::shared_ptr<nasm::Register> &dest,
                                 const std::shared_ptr<nasm::Addr> &val) {
    storeVReg(dest, val, offsets, text);
  };

  if (auto p = nasm::dyc<nasm::Mov>(inst)) {
    allocateMov(p, offsets, text);
    return;
  }
  if (auto p = nasm::dyc<nasm::BinaryInst>(inst)) {
    auto rhs = p->getRhs();
    if (auto reg = dycVReg(rhs)) {
      load(nasm::r10(), reg);
      rhs = nasm::r10();
    }
    auto lhs = p->getLhs();
    if (auto reg = dycVReg(lhs)) {
      load(nasm::r11(), reg);
      lhs = nasm::r11();
    }
    text.emplaceInst<nasm::BinaryInst>(p->getType(), lhs, rhs);
    if (auto reg = dycVReg(p->getLhs()))
      store(reg, lhs);
    return;
  }
  if (auto p = nasm::dyc<nasm::Push>(inst)) {
    auto reg = dycVReg(p->getReg());
    assert(reg);
    load(nasm::r10(), reg);
    text.emplaceInst<nasm::Push>(nasm::r10());
    return;
  }
  if (auto p = nasm::dyc<nasm::Pop>(inst)) {
    auto reg = dycVReg(p->getReg());
    assert(reg);
    text.emplaceInst<nasm::Pop>(nasm::r10());
    store(reg, nasm::r10());
    return;
  }
  if (auto p = nasm::dyc<nasm::Lea>(inst)) {
    auto reg = dycVReg(p->getDest());
    if (!reg)
      return;
    text.emplaceInst<nasm::Lea>(nasm::r10(), p->getAddr());
    store(reg, nasm::r10());
    return;
  }
  if (auto p = nasm::dyc<nasm::Cmp>(inst)) {
    auto lhs = p->getLhs();
    if (auto reg = dycVReg(lhs)) {
      loadVReg(nasm::r10(), reg, offsets, text);
      lhs = nasm::r10();
    }
    auto rhs = p->getRhs();
    if (auto reg = dycVReg(rhs)) {
      loadVReg(nasm::r11(), reg, offsets, text);
      rhs = nasm::r11();
    }
    text.emplaceInst<nasm::Cmp>(lhs, rhs);
    return;
  }
  if (auto p = nasm::dyc<nasm::Set>(inst)) {
    auto reg = dycVReg(p->getReg());
    if (!reg) {
      text.appendInst(p);
      return;
    }
    auto tmp = std::make_shared<nasm::Register>("r10b");
    text.emplaceInst<nasm::Set>(p->getOp(), tmp);
    storeVReg(reg, nasm::r10(), offsets, text);
    return;
  }
  if (auto p = nasm::dyc<nasm::UnaryInst>(inst)) {
    auto reg = dycVReg(p->getReg());
    if (!reg) {
      text.appendInst(p);
      return;
    }
    load(nasm::r10(), reg);
    text.emplaceInst<nasm::UnaryInst>(p->getOp(), nasm::r10());
    store(reg, nasm::r10());
    return;
  }
  if (auto p = nasm::dyc<nasm::IDiv>(inst)) {
    auto reg = dycVReg(p->getRhs());
    if (!reg) {
      text.appendInst(p);
      return;
    }
    load(nasm::r10(), reg);
    text.emplaceInst<nasm::IDiv>(nasm::r10());
    return;
  }

  assert(false);
}